

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int jx9Vfs_getmygid(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  void *pvVar1;
  code *pcVar2;
  int iVar3;
  jx9_value *pObj;
  undefined4 in_register_00000034;
  
  pvVar1 = pCtx->pFunc->pUserData;
  if ((pvVar1 == (void *)0x0) || (pcVar2 = *(code **)((long)pvVar1 + 0x140), pcVar2 == (code *)0x0))
  {
    jx9_context_throw_error_format
              (pCtx,2,"IO routine(%s) not implemented in the underlying VFS",
               (pCtx->pFunc->sName).zString);
    pObj = pCtx->pRet;
    jx9MemObjRelease(pObj);
    (pObj->x).iVal = -1;
  }
  else {
    iVar3 = (*pcVar2)(pCtx,CONCAT44(in_register_00000034,nArg));
    pObj = pCtx->pRet;
    jx9MemObjRelease(pObj);
    pObj->x = (anon_union_8_3_18420de5_for_x)(long)iVar3;
  }
  pObj->iFlags = pObj->iFlags & 0xfffffe90U | 2;
  return 0;
}

Assistant:

static int jx9Vfs_getmygid(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	jx9_vfs *pVfs;
	int nGid;
	/* Point to the underlying vfs */
	pVfs = (jx9_vfs *)jx9_context_user_data(pCtx);
	if( pVfs == 0 || pVfs->xGid == 0 ){
		SXUNUSED(nArg); /* cc warning */
		SXUNUSED(apArg);
		/* IO routine not implemented, return -1 */
		jx9_context_throw_error_format(pCtx, JX9_CTX_WARNING, 
			"IO routine(%s) not implemented in the underlying VFS", 
			jx9_function_name(pCtx)
			);
		jx9_result_int(pCtx, -1);
		return JX9_OK;
	}
	/* Perform the requested operation */
	nGid = pVfs->xGid();
	/* Set the result */
	jx9_result_int(pCtx, nGid);
	return JX9_OK;
}